

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:1179:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:1179:3)>
            *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:1179:3)>_2
  callback;
  Orphanage OVar1;
  
  if ((this->maybeFunc).ptr.isSet == true) {
    callback = (this->maybeFunc).ptr.field_1;
    (this->maybeFunc).ptr.isSet = false;
    capnp::MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)((long)callback + 0x68),0x400,GROW_HEURISTICALLY);
    OVar1 = capnp::MessageBuilder::getOrphanage((MessageBuilder *)((long)callback + 0x68));
    *(Orphanage *)((long)callback + 0x158) = OVar1;
    Arena::Arena((Arena *)((long)callback + 0x168),0x400);
    capnp::SchemaLoader::SchemaLoader
              ((SchemaLoader *)((long)callback + 0x188),(LazyLoadCallback *)callback);
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }